

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O0

int IteratorCubePairStart(cubedist CubeDist,Cube **ppC1,Cube **ppC2)

{
  int local_24;
  int fEntryFound;
  Cube **ppC2_local;
  Cube **ppC1_local;
  cubedist CubeDist_local;
  
  if (s_Iter.fStarted != 0) {
    __assert_fail("s_Iter.fStarted == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorList.c"
                  ,0x406,"int IteratorCubePairStart(cubedist, Cube **, Cube **)");
  }
  if (DIST4 < CubeDist) {
    __assert_fail("CubeDist >= 0 && CubeDist <= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorList.c"
                  ,0x407,"int IteratorCubePairStart(cubedist, Cube **, Cube **)");
  }
  s_Iter.fStarted = 1;
  s_Iter.PosStop = s_Que[CubeDist].PosIn;
  s_Iter.CutValue = -1;
  local_24 = 0;
  pQ = s_Que + CubeDist;
  s_Iter.Dist = CubeDist;
  s_Iter.ppC1 = ppC1;
  s_Iter.ppC2 = ppC2;
  do {
    if (pQ->PosOut == s_Iter.PosStop) {
LAB_003d7931:
      if (local_24 == 0) {
        s_Iter.fStarted = 0;
      }
      else {
        *ppC1 = pQ->pC1[pQ->PosOut];
        *ppC2 = pQ->pC2[pQ->PosOut];
        pQ->PosOut = (pQ->PosOut + 1) % s_nPosAlloc;
      }
      return local_24;
    }
    p1 = pQ->pC1[pQ->PosOut];
    p2 = pQ->pC2[pQ->PosOut];
    if ((p1->ID == pQ->ID1[pQ->PosOut]) && (p2->ID == pQ->ID2[pQ->PosOut])) {
      local_24 = 1;
      goto LAB_003d7931;
    }
    pQ->PosOut = (pQ->PosOut + 1) % s_nPosAlloc;
  } while( true );
}

Assistant:

int IteratorCubePairStart( cubedist CubeDist, Cube** ppC1, Cube** ppC2 )
// start an iterator through cubes of dist CubeDist,
// the resulting pointers are written into ppC1 and ppC2
// returns 1 if the first cube pair is found
{
    int fEntryFound;

    assert( s_Iter.fStarted == 0 );
    assert( CubeDist >= 0 && CubeDist <= 2 );

    s_Iter.fStarted = 1;
    s_Iter.Dist = CubeDist;
    s_Iter.ppC1 = ppC1;
    s_Iter.ppC2 = ppC2;

    s_Iter.PosStop = s_Que[ CubeDist ].PosIn;

    // determine the cut value
//  s_Iter.CutValue = s_nLiteralsInUse/s_nCubesInUse/2;
    s_Iter.CutValue = -1;

    fEntryFound = 0;
    // go through the entries while there is something in the queque
    for ( pQ = &s_Que[ CubeDist ]; pQ->PosOut != s_Iter.PosStop; pQ->PosOut = (pQ->PosOut+1)%s_nPosAlloc )
    {
        p1 = pQ->pC1[ pQ->PosOut ];
        p2 = pQ->pC2[ pQ->PosOut ];

        // check whether the entry is valid
        if ( p1->ID == pQ->ID1[ pQ->PosOut ] && 
             p2->ID == pQ->ID2[ pQ->PosOut ] ) //&&
             //p1->x + p1->y + p2->x + p2->y > s_Iter.CutValue )
        {
             fEntryFound = 1;
             break;
        }
    }

    if ( fEntryFound )
    { // write the result into the pick-up place
        *ppC1 = pQ->pC1[ pQ->PosOut ];
        *ppC2 = pQ->pC2[ pQ->PosOut ];

        pQ->PosOut = (pQ->PosOut+1)%s_nPosAlloc;
    }
    else
        s_Iter.fStarted = 0;
    return fEntryFound;
}